

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

bool __thiscall
density::
heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
::operator==(heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             *this,heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                   *i_source)

{
  bool bVar1;
  runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>
  *prVar2;
  runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>
  *i_other;
  void *i_first;
  void *i_second;
  int local_a4;
  undefined1 local_a0 [8];
  const_iterator it_1;
  const_iterator it_2;
  const_iterator end_2;
  const_iterator end_1;
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  *i_source_local;
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  *this_local;
  
  cend((const_iterator *)&end_2.m_value.m_pair.m_type,this);
  cend((const_iterator *)&it_2.m_value.m_pair.m_type,i_source);
  cbegin((const_iterator *)&it_1.m_value.m_pair.m_type,i_source);
  cbegin((const_iterator *)local_a0,this);
  do {
    bVar1 = const_iterator::operator!=
                      ((const_iterator *)local_a0,(const_iterator *)&end_2.m_value.m_pair.m_type);
    if (!bVar1) {
      local_a4 = 2;
LAB_0208815c:
      const_iterator::~const_iterator((const_iterator *)local_a0);
      if (local_a4 == 2) {
        this_local._7_1_ =
             const_iterator::operator==
                       ((const_iterator *)&it_1.m_value.m_pair.m_type,
                        (const_iterator *)&it_2.m_value.m_pair.m_type);
      }
      const_iterator::~const_iterator((const_iterator *)&it_1.m_value.m_pair.m_type);
      const_iterator::~const_iterator((const_iterator *)&it_2.m_value.m_pair.m_type);
      const_iterator::~const_iterator((const_iterator *)&end_2.m_value.m_pair.m_type);
      return (bool)(this_local._7_1_ & 1);
    }
    bVar1 = const_iterator::operator==
                      ((const_iterator *)&it_1.m_value.m_pair.m_type,
                       (const_iterator *)&it_2.m_value.m_pair.m_type);
    if (bVar1) {
LAB_02088130:
      this_local._7_1_ = 0;
      local_a4 = 1;
      goto LAB_0208815c;
    }
    prVar2 = const_iterator::complete_type((const_iterator *)local_a0);
    i_other = const_iterator::complete_type((const_iterator *)&it_1.m_value.m_pair.m_type);
    bVar1 = runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>
            ::operator!=(prVar2,i_other);
    if (bVar1) goto LAB_02088130;
    prVar2 = const_iterator::complete_type((const_iterator *)local_a0);
    i_first = const_iterator::element_ptr((const_iterator *)local_a0);
    i_second = const_iterator::element_ptr((const_iterator *)&it_1.m_value.m_pair.m_type);
    bVar1 = runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>
            ::are_equal(prVar2,i_first,i_second);
    if (!bVar1) goto LAB_02088130;
    const_iterator::operator++((const_iterator *)local_a0);
    const_iterator::operator++((const_iterator *)&it_1.m_value.m_pair.m_type);
  } while( true );
}

Assistant:

bool operator==(const heter_queue & i_source) const
        {
            const auto end_1 = cend();
            const auto end_2 = i_source.cend();
            auto       it_2  = i_source.cbegin();
            for (auto it_1 = cbegin(); it_1 != end_1; ++it_1, ++it_2)
            {
                if (
                  it_2 == end_2 || it_1.complete_type() != it_2.complete_type() ||
                  !it_1.complete_type().are_equal(it_1.element_ptr(), it_2.element_ptr()))
                {
                    return false;
                }
            }
            return it_2 == end_2;
        }